

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_vumeter.c
# Opt level: O2

void * vu_new(t_symbol *s,int argc,t_atom *argv)

{
  t_iem_fstyle_flags tVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  t_vu *x;
  _glist *p_Var5;
  t_symbol *ptVar6;
  _outlet *p_Var7;
  uint uVar8;
  uint uVar9;
  t_float tVar10;
  t_float tVar11;
  int local_8c;
  undefined8 local_88;
  int local_78;
  t_iemgui_drawfunctions local_68;
  
  x = (t_vu *)iemgui_new(vu_class);
  p_Var5 = canvas_getcurrent();
  uVar9 = 1;
  iVar2 = sys_zoomfontheight(p_Var5->gl_font,1,0);
  p_Var5 = canvas_getcurrent();
  iVar3 = sys_zoomfontheight(p_Var5->gl_font,1,0);
  p_Var5 = canvas_getcurrent();
  iVar4 = sys_zoomfontheight(p_Var5->gl_font,1,0);
  local_78 = (x->x_gui).x_fontsize;
  local_68.draw_new = vu_draw_new;
  local_68.draw_config = vu_draw_config;
  local_68.draw_iolets = vu_draw_io;
  local_68.draw_update = vu_draw_update;
  local_68.draw_select = vu_draw_select;
  local_68.draw_erase = (t_iemdrawfunptr)0x0;
  local_68.draw_move = (t_iemdrawfunptr)0x0;
  iemgui_setdrawfunctions((t_iemgui *)x,&local_68);
  (x->x_gui).x_bcol = 0x404040;
  if ((((((argc < 0xb) || (argv->a_type != A_FLOAT)) || (argv[1].a_type != A_FLOAT)) ||
       ((1 < argv[2].a_type - A_FLOAT || (1 < argv[3].a_type - A_FLOAT)))) ||
      ((argv[4].a_type != A_FLOAT || ((argv[5].a_type != A_FLOAT || (argv[6].a_type != A_FLOAT))))))
     || ((argv[7].a_type != A_FLOAT || (argv[10].a_type != A_FLOAT)))) {
    local_8c = (int)((double)(iVar3 * 0xa0 + 800) / 15.0);
    iVar2 = iVar2 + 5;
    iemgui_new_getnames((t_iemgui *)x,1,(t_atom *)0x0);
    local_88 = CONCAT44((int)((double)(iVar4 * -8 + -0x28) / 15.0),0xffffffff);
  }
  else {
    tVar10 = atom_getfloatarg(0,argc,argv);
    iVar2 = (int)tVar10;
    tVar10 = atom_getfloatarg(1,argc,argv);
    local_8c = (int)tVar10;
    iemgui_new_getnames((t_iemgui *)x,1,argv);
    ptVar6 = gensym("nosndno");
    (x->x_gui).x_snd = ptVar6;
    (x->x_gui).x_snd_unexpanded = ptVar6;
    tVar10 = atom_getfloatarg(4,argc,argv);
    tVar11 = atom_getfloatarg(5,argc,argv);
    local_88 = CONCAT44((int)tVar11,(int)tVar10);
    tVar10 = atom_getfloatarg(6,argc,argv);
    iem_inttofstyle(&(x->x_gui).x_fsf,(int)tVar10);
    tVar10 = atom_getfloatarg(7,argc,argv);
    local_78 = (int)tVar10;
    iemgui_all_loadcolors((t_iemgui *)x,argv + 8,(t_atom *)0x0,argv + 9);
    tVar10 = atom_getfloatarg(10,argc,argv);
    uVar9 = (uint)((int)tVar10 != 0);
  }
  if ((argc == 0xc) && (argv[0xb].a_type == A_FLOAT)) {
    tVar10 = atom_getfloatarg(0xb,0xc,argv);
    iem_inttosymargs(&(x->x_gui).x_isa,(int)tVar10);
  }
  tVar1 = (x->x_gui).x_fsf;
  ptVar6 = (x->x_gui).x_rcv;
  uVar8 = (uint)(ptVar6 != (t_symbol *)0x0) << 6;
  (x->x_gui).x_fsf = (t_iem_fstyle_flags)((uint)tVar1 & 0xffffff3f | uVar8);
  if (((uint)tVar1 & 0x3f) == 1) {
    builtin_strncpy((x->x_gui).x_font,"helvetica",10);
LAB_00160374:
    if (ptVar6 == (t_symbol *)0x0) goto LAB_00160388;
  }
  else {
    if (((uint)tVar1 & 0x3f) == 2) {
      builtin_strncpy((x->x_gui).x_font,"times",6);
      goto LAB_00160374;
    }
    (x->x_gui).x_fsf = (t_iem_fstyle_flags)((uint)tVar1 & 0xffffff00 | uVar8);
    strcpy((x->x_gui).x_font,sys_font);
    if (((uint)(x->x_gui).x_fsf & 0x40) == 0) goto LAB_00160388;
  }
  pd_bind((t_pd *)x,(x->x_gui).x_rcv);
LAB_00160388:
  (x->x_gui).x_ldx = (undefined4)local_88;
  (x->x_gui).x_ldy = local_88._4_4_;
  iVar3 = 4;
  if (4 < local_78) {
    iVar3 = local_78;
  }
  (x->x_gui).x_fontsize = iVar3;
  iVar2 = iemgui_clip_size(iVar2);
  (x->x_gui).x_w = iVar2;
  vu_check_height(x,local_8c);
  x->x_scale = uVar9;
  x->x_peak = 0;
  x->x_rms = 0;
  x->x_fp = -101.0;
  x->x_fr = -101.0;
  iemgui_verify_snd_ne_rcv((t_iemgui *)x);
  ptVar6 = gensym("ft1");
  inlet_new((t_object *)x,(t_pd *)x,&s_float,ptVar6);
  p_Var7 = outlet_new((t_object *)x,&s_float);
  x->x_out_rms = p_Var7;
  p_Var7 = outlet_new((t_object *)x,&s_float);
  x->x_out_peak = p_Var7;
  (x->x_gui).x_h = (x->x_gui).x_h / ((x->x_gui).x_glist)->gl_zoom;
  iemgui_newzoom((t_iemgui *)x);
  return x;
}

Assistant:

static void *vu_new(t_symbol *s, int argc, t_atom *argv)
{
    t_vu *x = (t_vu *)iemgui_new(vu_class);
    int w = IEM_GUI_DEFAULTSIZE, h = IEM_VU_STEPS*IEM_VU_DEFAULTSIZE * IEM_GUI_DEFAULTSIZE_SCALE;
    int ldx = -1, ldy = -8 * IEM_GUI_DEFAULTSIZE_SCALE, f = 0, scale = 1;
    int fs = x->x_gui.x_fontsize;
    int ftbreak = IEM_BNG_DEFAULTBREAKFLASHTIME, fthold = IEM_BNG_DEFAULTHOLDFLASHTIME;
    char str[144];

    IEMGUI_SETDRAWFUNCTIONS(x, vu);

    x->x_gui.x_bcol = 0x404040;

    if((argc >= 11)&&IS_A_FLOAT(argv,0)&&IS_A_FLOAT(argv,1)
       &&(IS_A_SYMBOL(argv,2)||IS_A_FLOAT(argv,2))
       &&(IS_A_SYMBOL(argv,3)||IS_A_FLOAT(argv,3))
       &&IS_A_FLOAT(argv,4)&&IS_A_FLOAT(argv,5)
       &&IS_A_FLOAT(argv,6)&&IS_A_FLOAT(argv,7)
       &&IS_A_FLOAT(argv,10))
    {
        w = (int)atom_getfloatarg(0, argc, argv);
        h = (int)atom_getfloatarg(1, argc, argv);
        iemgui_new_getnames(&x->x_gui, 1, argv);
        x->x_gui.x_snd_unexpanded = x->x_gui.x_snd = gensym("nosndno"); /*no send*/
        ldx = (int)atom_getfloatarg(4, argc, argv);
        ldy = (int)atom_getfloatarg(5, argc, argv);
        iem_inttofstyle(&x->x_gui.x_fsf, atom_getfloatarg(6, argc, argv));
        fs = (int)atom_getfloatarg(7, argc, argv);
        iemgui_all_loadcolors(&x->x_gui, argv+8, NULL, argv+9);
        scale = (int)atom_getfloatarg(10, argc, argv);
    }
    else iemgui_new_getnames(&x->x_gui, 1, 0);
    if((argc == 12)&&IS_A_FLOAT(argv,11))
        iem_inttosymargs(&x->x_gui.x_isa, atom_getfloatarg(11, argc, argv));

    x->x_gui.x_fsf.x_snd_able = 0;
    x->x_gui.x_fsf.x_rcv_able = (0 != x->x_gui.x_rcv);
    if (x->x_gui.x_fsf.x_font_style == 1)
        strcpy(x->x_gui.x_font, "helvetica");
    else if(x->x_gui.x_fsf.x_font_style == 2)
        strcpy(x->x_gui.x_font, "times");
    else { x->x_gui.x_fsf.x_font_style = 0;
        strcpy(x->x_gui.x_font, sys_font); }
    if(x->x_gui.x_fsf.x_rcv_able)
        pd_bind(&x->x_gui.x_obj.ob_pd, x->x_gui.x_rcv);
    x->x_gui.x_ldx = ldx;
    x->x_gui.x_ldy = ldy;
    x->x_gui.x_fontsize = (fs < 4)?4:fs;
    x->x_gui.x_w = iemgui_clip_size(w);
    vu_check_height(x, h);
    if(scale != 0)
        scale = 1;
    x->x_scale = scale;
    x->x_peak = 0;
    x->x_rms = 0;
    x->x_fp = -101.0;
    x->x_fr = -101.0;
    iemgui_verify_snd_ne_rcv(&x->x_gui);
    inlet_new(&x->x_gui.x_obj, &x->x_gui.x_obj.ob_pd, &s_float, gensym("ft1"));
    x->x_out_rms = outlet_new(&x->x_gui.x_obj, &s_float);
    x->x_out_peak = outlet_new(&x->x_gui.x_obj, &s_float);
    x->x_gui.x_h /= IEMGUI_ZOOM(x); /* unzoom, to prevent double-application in iemgui_newzoom */
    iemgui_newzoom(&x->x_gui);
    return (x);
}